

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O2

bool cppjieba::DecodeRunesInString(char *s,size_t len,RuneStrArray *runes)

{
  RuneStrLite RVar1;
  uint32_t uVar2;
  ulong uVar3;
  RuneStr x;
  RuneStr local_4c;
  char *local_38;
  
  local_38 = s;
  limonp::LocalVector<cppjieba::RuneStr>::clear(runes);
  limonp::LocalVector<cppjieba::RuneStr>::reserve(runes,len >> 1);
  uVar2 = 0;
  uVar3 = 0;
  do {
    if (len < uVar3 || len - uVar3 == 0) {
LAB_00117fb1:
      return len <= uVar3;
    }
    RVar1 = DecodeRuneInString(local_38 + uVar3,len - uVar3);
    if ((ulong)RVar1 >> 0x20 == 0) {
      limonp::LocalVector<cppjieba::RuneStr>::clear(runes);
      goto LAB_00117fb1;
    }
    local_4c.rune = RVar1.rune;
    local_4c.unicode_length = 1;
    local_4c.offset = (uint32_t)uVar3;
    local_4c.len = RVar1.len;
    local_4c.unicode_offset = uVar2;
    limonp::LocalVector<cppjieba::RuneStr>::push_back(runes,&local_4c);
    uVar3 = (ulong)((uint32_t)uVar3 + RVar1.len);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

inline bool DecodeRunesInString(const char* s, size_t len, RuneStrArray& runes) {
  runes.clear();
  runes.reserve(len / 2);
  for (uint32_t i = 0, j = 0; i < len;) {
    RuneStrLite rp = DecodeRuneInString(s + i, len - i);
    if (rp.len == 0) {
      runes.clear();
      return false;
    }
    RuneStr x(rp.rune, i, rp.len, j, 1);
    runes.push_back(x);
    i += rp.len;
    ++j;
  }
  return true;
}